

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.cpp
# Opt level: O1

RealType __thiscall OpenMD::CubicSpline::getSpacing(CubicSpline *this)

{
  RealType RVar1;
  
  if (this->generated == false) {
    generate(this);
  }
  if (this->isUniform == false) {
    RVar1 = 0.0;
  }
  else {
    RVar1 = 1.0 / this->dx;
  }
  return RVar1;
}

Assistant:

RealType CubicSpline::getSpacing() {
    if (!generated) generate();
    assert(isUniform);
    if (isUniform)
      return 1.0 / dx;
    else
      return 0.0;
  }